

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elf_mem_image.cc
# Opt level: O2

bool __thiscall
absl::debugging_internal::ElfMemImage::LookupSymbol
          (ElfMemImage *this,char *name,char *version,int type,SymbolInfo *info_out)

{
  int iVar1;
  Elf64_Word EVar2;
  ElfMemImage *__range2;
  bool bVar3;
  SymbolIterator __begin2;
  SymbolIterator local_60;
  
  begin(&local_60,this);
  if (this->hash_ == (Elf64_Word *)0x0) {
    EVar2 = 0;
  }
  else {
    EVar2 = this->hash_[1];
  }
  while( true ) {
    bVar3 = local_60.index_ != EVar2 || (ElfMemImage *)local_60.image_ != this;
    if (local_60.index_ == EVar2 && (ElfMemImage *)local_60.image_ == this) {
      return bVar3;
    }
    iVar1 = strcmp(local_60.info_.name,name);
    if (((iVar1 == 0) && (iVar1 = strcmp(local_60.info_.version,version), iVar1 == 0)) &&
       (((local_60.info_.symbol)->st_info & 0xf) == type)) break;
    SymbolIterator::operator++(&local_60);
  }
  if (info_out == (SymbolInfo *)0x0) {
    return bVar3;
  }
  info_out->address = local_60.info_.address;
  info_out->symbol = local_60.info_.symbol;
  info_out->name = local_60.info_.name;
  info_out->version = local_60.info_.version;
  return bVar3;
}

Assistant:

bool ElfMemImage::LookupSymbol(const char *name,
                               const char *version,
                               int type,
                               SymbolInfo *info_out) const {
  for (const SymbolInfo& info : *this) {
    if (strcmp(info.name, name) == 0 && strcmp(info.version, version) == 0 &&
        ElfType(info.symbol) == type) {
      if (info_out) {
        *info_out = info;
      }
      return true;
    }
  }
  return false;
}